

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_c14n(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  xmlDocPtr pxVar5;
  long lVar6;
  int n_compression;
  int iVar7;
  ulong uVar8;
  int n_doc;
  uint uVar9;
  undefined4 uVar10;
  ulong in_RSI;
  undefined *puVar11;
  int n_with_comments;
  uint uVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 *puVar15;
  ulong uVar16;
  uint uVar17;
  int test_ret;
  int test_ret_2;
  int test_ret_1;
  uint local_54;
  int local_48;
  int local_44;
  int local_40;
  
  if (quiet == '\0') {
    puts("Testing c14n : 3 of 4 functions ...");
  }
  local_48 = 0;
  uVar9 = 0;
  do {
    uVar17 = 0;
    do {
      uVar12 = 0;
      puVar15 = &DAT_00158240;
      do {
        iVar4 = (int)in_RSI;
        iVar3 = xmlMemBlocks();
        pxVar5 = gen_xmlDocPtr(uVar9,iVar4);
        uVar10 = 0xffffffff;
        uVar14 = 0xffffffff;
        if (uVar17 < 4) {
          uVar14 = (&DAT_00158240)[uVar17];
        }
        if (uVar12 < 4) {
          uVar10 = *puVar15;
        }
        in_RSI = 0;
        xmlC14NDocDumpMemory(pxVar5,0,uVar14,0,uVar10,0);
        call_tests = call_tests + 1;
        if (((pxVar5 != (xmlDocPtr)0x0) && (api_doc != pxVar5)) && (pxVar5->doc != api_doc)) {
          xmlFreeDoc(pxVar5);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlC14NDocDumpMemory",(ulong)(uint)(iVar4 - iVar3));
          local_48 = local_48 + 1;
          printf(" %d",(ulong)uVar9);
          printf(" %d",0);
          printf(" %d",(ulong)uVar17);
          printf(" %d",0);
          printf(" %d");
          in_RSI = 0;
          printf(" %d");
          putchar(10);
        }
        uVar12 = uVar12 + 1;
        puVar15 = puVar15 + 1;
      } while (uVar12 != 4);
      uVar17 = uVar17 + 1;
    } while (uVar17 != 4);
    uVar9 = uVar9 + 1;
  } while (uVar9 != 4);
  function_tests = function_tests + 1;
  local_40 = 0;
  local_54 = 0;
  do {
    uVar9 = 0;
    do {
      uVar13 = 0;
      do {
        uVar16 = 0;
        do {
          uVar8 = 0;
          puVar15 = &DAT_00158240;
          do {
            iVar4 = (int)in_RSI;
            iVar3 = xmlMemBlocks();
            pxVar5 = gen_xmlDocPtr(local_54,iVar4);
            uVar10 = 0xffffffff;
            uVar14 = 0xffffffff;
            if (uVar9 < 4) {
              uVar14 = (&DAT_00158240)[uVar9];
            }
            if ((uint)uVar13 < 4) {
              uVar10 = (&DAT_00158240)[uVar13];
            }
            if ((uint)uVar16 < 5) {
              puVar11 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar16];
            }
            else {
              puVar11 = (undefined *)0x0;
            }
            in_RSI = 0;
            xmlC14NDocSave(pxVar5,0,uVar14,0,uVar10,puVar11,*puVar15);
            call_tests = call_tests + 1;
            if (((pxVar5 != (xmlDocPtr)0x0) && (api_doc != pxVar5)) && (pxVar5->doc != api_doc)) {
              xmlFreeDoc(pxVar5);
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            iVar7 = (int)uVar8;
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlC14NDocSave",(ulong)(uint)(iVar4 - iVar3));
              local_40 = local_40 + 1;
              printf(" %d",(ulong)local_54);
              printf(" %d",0);
              printf(" %d",(ulong)uVar9);
              printf(" %d",0);
              printf(" %d",uVar13);
              printf(" %d",uVar16);
              printf(" %d");
              putchar(10);
              in_RSI = uVar8;
            }
            uVar17 = iVar7 + 1;
            uVar8 = (ulong)uVar17;
            puVar15 = puVar15 + 1;
          } while (uVar17 != 4);
          uVar17 = (uint)uVar16 + 1;
          uVar16 = (ulong)uVar17;
        } while (uVar17 != 6);
        uVar17 = (uint)uVar13 + 1;
        uVar13 = (ulong)uVar17;
      } while (uVar17 != 4);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 4);
    local_54 = local_54 + 1;
  } while (local_54 != 4);
  function_tests = function_tests + 1;
  local_44 = 0;
  local_54 = 0;
  do {
    uVar9 = 0;
    do {
      uVar17 = 0;
      do {
        uVar12 = 0;
        bVar2 = true;
        do {
          bVar1 = bVar2;
          iVar4 = (int)in_RSI;
          iVar3 = xmlMemBlocks();
          pxVar5 = gen_xmlDocPtr(local_54,iVar4);
          uVar10 = 0xffffffff;
          uVar14 = 0xffffffff;
          if (uVar9 < 4) {
            uVar14 = (&DAT_00158240)[uVar9];
          }
          if (uVar17 < 4) {
            uVar10 = (&DAT_00158240)[uVar17];
          }
          if (bVar1) {
            lVar6 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            lVar6 = 0;
          }
          in_RSI = 0;
          xmlC14NDocSaveTo(pxVar5,0,uVar14,0,uVar10,lVar6);
          call_tests = call_tests + 1;
          if (((pxVar5 != (xmlDocPtr)0x0) && (api_doc != pxVar5)) && (pxVar5->doc != api_doc)) {
            xmlFreeDoc(pxVar5);
          }
          if (lVar6 != 0) {
            xmlOutputBufferClose(lVar6);
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlC14NDocSaveTo",(ulong)(uint)(iVar4 - iVar3));
            local_44 = local_44 + 1;
            printf(" %d",(ulong)local_54);
            printf(" %d",0);
            printf(" %d",(ulong)uVar9);
            printf(" %d",0);
            printf(" %d",(ulong)uVar17);
            in_RSI = (ulong)uVar12;
            printf(" %d");
            putchar(10);
          }
          uVar12 = 1;
          bVar2 = false;
        } while (bVar1);
        uVar17 = uVar17 + 1;
      } while (uVar17 != 4);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 4);
    local_54 = local_54 + 1;
  } while (local_54 != 4);
  function_tests = function_tests + 1;
  uVar9 = local_40 + local_48 + local_44;
  if (uVar9 != 0) {
    printf("Module c14n: %d errors\n",(ulong)uVar9);
  }
  return uVar9;
}

Assistant:

static int
test_c14n(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing c14n : 3 of 4 functions ...\n");
    test_ret += test_xmlC14NDocDumpMemory();
    test_ret += test_xmlC14NDocSave();
    test_ret += test_xmlC14NDocSaveTo();
    test_ret += test_xmlC14NExecute();

    if (test_ret != 0)
	printf("Module c14n: %d errors\n", test_ret);
    return(test_ret);
}